

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_wi.c
# Opt level: O0

void func_exc_pol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                 xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t542;
  double t541;
  double t538;
  double t537;
  double t536;
  double t535;
  double t532;
  double t531;
  double t530;
  double t529;
  double t528;
  double t527;
  double t526;
  double t525;
  double t524;
  double t523;
  double t521;
  double t519;
  double t518;
  double t517;
  double t516;
  double t515;
  double t513;
  double t512;
  double t511;
  double t510;
  double t509;
  double t508;
  double t507;
  double t505;
  double t502;
  double t500;
  double t496;
  double t495;
  double t493;
  double t492;
  double t491;
  double t488;
  double t483;
  double t479;
  double t478;
  double t475;
  double t470;
  double t468;
  double t467;
  double t466;
  double t465;
  double t464;
  double t463;
  double t462;
  double t461;
  double t460;
  double t459;
  double t458;
  double t457;
  double t456;
  double t454;
  double t453;
  double t450;
  double t448;
  double t445;
  double t442;
  double t441;
  double t439;
  double t437;
  double t436;
  double t431;
  double t430;
  double t429;
  double t428;
  double t427;
  double t424;
  double t423;
  double t421;
  double t420;
  double t419;
  double t418;
  double t417;
  double t416;
  double t415;
  double t414;
  double t413;
  double t412;
  double t410;
  double t409;
  double t408;
  double t407;
  double t405;
  double t401;
  double t400;
  double t398;
  double t397;
  double t394;
  double t388;
  double t387;
  double t386;
  double t383;
  double t378;
  double t374;
  double t373;
  double t370;
  double t365;
  double t363;
  double t361;
  double t360;
  double t357;
  double t355;
  double t353;
  double t351;
  double t348;
  double t347;
  double t345;
  double t343;
  double t341;
  double t340;
  double t339;
  double t338;
  double t333;
  double t332;
  double t331;
  double t330;
  double t329;
  double t328;
  double t325;
  double t324;
  double t322;
  double t321;
  double t320;
  double t319;
  double t318;
  double t317;
  double t316;
  double t315;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t306;
  double t304;
  double t303;
  double t299;
  double t298;
  double t296;
  double t295;
  double t294;
  double t291;
  double t285;
  double t284;
  double t283;
  double t280;
  double t275;
  double t271;
  double t270;
  double t267;
  double t262;
  double t260;
  double t259;
  double t255;
  double t253;
  double t251;
  double t250;
  double t247;
  double t245;
  double t243;
  double t242;
  double t241;
  double t240;
  double t239;
  double t238;
  double t237;
  double t236;
  double t234;
  double t231;
  double t230;
  double t228;
  double t226;
  double t224;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t216;
  double t215;
  double t214;
  double t212;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t202;
  double t201;
  double t199;
  double t198;
  double t196;
  double t195;
  double t194;
  double t193;
  double t192;
  double t191;
  double t187;
  double t184;
  double t181;
  double t180;
  double t178;
  double t177;
  double t175;
  double t173;
  double t172;
  double t169;
  double t168;
  double t166;
  double t163;
  double t160;
  double t157;
  double t156;
  double t154;
  double t153;
  double t151;
  double t150;
  double t147;
  double t146;
  double t145;
  double t144;
  double t143;
  double t140;
  double t139;
  double t138;
  double t137;
  double t136;
  double t134;
  double t133;
  double t132;
  double t130;
  double t127;
  double t126;
  double t125;
  double t123;
  double t122;
  double t121;
  double t120;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t110;
  double t109;
  double t105;
  double t104;
  double t102;
  double t101;
  double t99;
  double t98;
  double t97;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t88;
  double t85;
  double t82;
  double t81;
  double t79;
  double t78;
  double t76;
  double t74;
  double t73;
  double t72;
  double t69;
  double t68;
  double t66;
  double t63;
  double t60;
  double t57;
  double t56;
  double t54;
  double t53;
  double t51;
  double t50;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t32;
  double t31;
  double t30;
  double t29;
  double t28;
  double t27;
  double t26;
  double t25;
  double t24;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t17;
  double t16;
  double t15;
  double t14;
  double t13;
  double t12;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double t3;
  double local_b48;
  double local_b40;
  double local_b30;
  double local_b20;
  double local_b18;
  double local_b10;
  double local_b08;
  double local_af8;
  double local_af0;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  bool local_ac1;
  double local_ac0;
  double local_ab8;
  double local_ab0;
  double local_aa8;
  double local_aa0;
  double local_a98;
  bool local_a89;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = *in_RDX - in_RDX[1];
  __x = *in_RDX + in_RDX[1];
  dVar5 = dVar4 * (1.0 / __x);
  dVar6 = dVar5 + 1.0;
  dVar7 = (double)(dVar6 <= (double)in_RDI[0x31]);
  local_a89 = *in_RDX <= (double)in_RDI[0x30] || dVar7 != 0.0;
  dVar8 = (double)local_a89;
  dVar9 = cbrt(0.3183098861837907);
  dVar10 = dVar9 * 2.519842099789747 * 1.2599210498948732;
  dVar11 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_b20 = cbrt((double)in_RDI[0x31]);
  local_b48 = local_b20 * (double)in_RDI[0x31];
  local_a98 = local_b48;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_a98 = 2.5198420997897464;
  }
  dVar12 = cbrt(__x);
  dVar13 = cbrt(1.0 / dVar6);
  dVar14 = cbrt(9.0);
  dVar14 = dVar14 * dVar14 * dVar9 * dVar9 * (double)in_RDI[4] * 1.4422495703074083;
  dVar15 = (1.0 / dVar12) * 1.2599210498948732;
  local_aa0 = local_b20;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa0 = 1.2599210498948732;
  }
  local_ab0 = (dVar14 * dVar15 * dVar13 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ab0;
  dVar11 = (double)(1.35 < local_ab0);
  local_aa8 = local_ab0;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa8 = 1.35;
  }
  local_aa8 = local_aa8 * local_aa8;
  dVar16 = local_aa8 * local_aa8;
  dVar17 = dVar16 * dVar16;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_ab0 = 1.35;
  }
  dVar11 = sqrt(3.141592653589793);
  dVar18 = erf((1.0 / local_ab0) / 2.0);
  dVar19 = exp(-(1.0 / (local_ab0 * local_ab0)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ab8 = (((((((1.0 / local_aa8) / 36.0 - (1.0 / dVar16) / 960.0) +
                    (1.0 / (dVar16 * local_aa8)) / 26880.0) - (1.0 / dVar17) / 829440.0) +
                  ((1.0 / dVar17) / local_aa8) / 28385280.0) -
                 ((1.0 / dVar17) / dVar16) / 1073479680.0) +
                ((1.0 / dVar17) / (dVar16 * local_aa8)) / 44590694400.0) -
                (1.0 / (dVar17 * dVar17)) / 2021444812800.0;
  }
  else {
    local_ab8 = -(local_ab0 * 2.6666666666666665) *
                (local_ab0 * 2.0 *
                 (-(local_ab0 * local_ab0 * 2.0) * (dVar19 - 1.0) + (dVar19 - 1.5)) +
                dVar11 * dVar18) + 1.0;
  }
  dVar16 = *pdVar1;
  dVar17 = pdVar1[1];
  dVar18 = *in_RCX;
  dVar20 = *in_RDX * *in_RDX;
  dVar21 = cbrt(*in_RDX);
  dVar22 = (1.0 / (dVar21 * dVar21)) / dVar20;
  dVar23 = *in_RCX * dVar22;
  dVar19 = pdVar1[2];
  dVar24 = cbrt(9.869604401089358);
  dVar24 = dVar24 * dVar24 * 3.3019272488946267;
  dVar25 = dVar24 * 0.3;
  dVar21 = *in_R9 * ((1.0 / (dVar21 * dVar21)) / *in_RDX);
  dVar26 = dVar25 - dVar21;
  dVar27 = dVar25 + dVar21;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_ac0 = 0.0;
  }
  else {
    local_ac0 = dVar6 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar13) * local_ab8 *
                (dVar19 * dVar26 * (1.0 / dVar27) +
                dVar17 * dVar18 * 0.003840616724010807 * dVar22 *
                (1.0 / (dVar23 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  dVar5 = 1.0 - dVar5;
  dVar13 = (double)(dVar5 <= (double)in_RDI[0x31]);
  local_ac1 = in_RDX[1] <= (double)in_RDI[0x30] || dVar13 != 0.0;
  dVar18 = (double)local_ac1;
  dVar28 = cbrt(1.0 / dVar5);
  local_ad8 = (dVar14 * dVar15 * dVar28 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ad8;
  dVar14 = (double)(1.35 < local_ad8);
  local_ad0 = local_ad8;
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    local_ad0 = 1.35;
  }
  local_ad0 = local_ad0 * local_ad0;
  dVar29 = local_ad0 * local_ad0;
  dVar30 = dVar29 * dVar29;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_ad8 = 1.35;
  }
  dVar14 = erf((1.0 / local_ad8) / 2.0);
  dVar31 = exp(-(1.0 / (local_ad8 * local_ad8)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ae0 = (((((((1.0 / local_ad0) / 36.0 - (1.0 / dVar29) / 960.0) +
                    (1.0 / (dVar29 * local_ad0)) / 26880.0) - (1.0 / dVar30) / 829440.0) +
                  ((1.0 / dVar30) / local_ad0) / 28385280.0) -
                 ((1.0 / dVar30) / dVar29) / 1073479680.0) +
                ((1.0 / dVar30) / (dVar29 * local_ad0)) / 44590694400.0) -
                (1.0 / (dVar30 * dVar30)) / 2021444812800.0;
  }
  else {
    local_ae0 = -(local_ad8 * 2.6666666666666665) *
                (local_ad8 * 2.0 *
                 (-(local_ad8 * local_ad8 * 2.0) * (dVar31 - 1.0) + (dVar31 - 1.5)) +
                dVar11 * dVar14) + 1.0;
  }
  dVar11 = in_RCX[2];
  dVar14 = in_RDX[1] * in_RDX[1];
  dVar29 = cbrt(in_RDX[1]);
  dVar30 = (1.0 / (dVar29 * dVar29)) / dVar14;
  dVar31 = in_RCX[2] * dVar30;
  dVar32 = in_R9[1] * ((1.0 / (dVar29 * dVar29)) / in_RDX[1]);
  dVar29 = dVar25 - dVar32;
  dVar25 = dVar25 + dVar32;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_ae8 = 0.0;
  }
  else {
    local_ae8 = dVar5 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar28) * local_ae0 *
                (dVar19 * dVar29 * (1.0 / dVar25) +
                dVar17 * dVar11 * 0.003840616724010807 * dVar30 *
                (1.0 / (dVar31 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  if ((dVar7 != 0.0) || (local_af0 = dVar6, NAN(dVar7))) {
    local_af0 = (double)in_RDI[0x31];
  }
  dVar10 = dVar9 * 1.4422495703074083 * 2.519842099789747;
  local_b20 = 1.0 / local_b20;
  dVar11 = cbrt(dVar6);
  local_af8 = local_b20;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_af8 = 1.0 / dVar11;
  }
  dVar16 = dVar10 * dVar15 * local_af8;
  dVar17 = sqrt(dVar16);
  dVar19 = sqrt(dVar16);
  dVar19 = dVar16 * dVar19;
  dVar28 = dVar9 * dVar9 * 2.080083823051904;
  dVar33 = dVar28 * 1.5874010519681996;
  dVar34 = 1.0 / (dVar12 * dVar12);
  dVar35 = dVar34 * 1.5874010519681996;
  dVar36 = dVar33 * dVar35 * local_af8 * local_af8;
  dVar37 = log(16.081979498692537 /
               (dVar36 * 0.123235 + dVar19 * 0.204775 + dVar17 * 3.79785 + dVar16 * 0.8969) + 1.0);
  dVar37 = (dVar16 * 0.053425 + 1.0) * 0.0621814 * dVar37;
  local_b08 = local_b48;
  if ((double)in_RDI[0x31] < 0.0) {
    local_b08 = 0.0;
  }
  dVar38 = ((local_a98 + local_b08) - 2.0) * 1.9236610509315362;
  dVar39 = log(32.16395899738507 /
               (dVar36 * 0.1562925 + dVar19 * 0.420775 + dVar17 * 7.05945 + dVar16 * 1.549425) + 1.0
              );
  dVar17 = log(29.608749977793437 /
               (dVar36 * 0.1241775 + dVar19 * 0.1100325 + dVar17 * 5.1785 + dVar16 * 0.905775) + 1.0
              );
  dVar17 = (dVar16 * 0.0278125 + 1.0) * dVar17;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_b10 = 0.0;
  }
  else {
    local_b10 = (local_af0 *
                (dVar38 * 0.0197516734986138 * dVar17 +
                dVar38 * (dVar17 * -0.0197516734986138 +
                         (dVar16 * 0.05137 + 1.0) * -0.0310907 * dVar39 + dVar37) + -dVar37)) / 2.0;
  }
  dVar8 = pdVar1[3];
  dVar16 = *in_RCX;
  dVar37 = dVar23 * 0.46914023462026644 + 1.0;
  dVar17 = pdVar1[4];
  dVar19 = pdVar1[5];
  dVar39 = dVar26 * dVar26;
  dVar40 = dVar27 * dVar27;
  dVar36 = pdVar1[6];
  dVar41 = *in_RCX * *in_RCX;
  dVar41 = dVar41 * dVar41 * dVar41;
  dVar20 = dVar20 * dVar20 * dVar20 * dVar20;
  dVar42 = 1.0 / (dVar20 * dVar20);
  dVar43 = dVar37 * dVar37;
  dVar43 = (1.0 / (dVar43 * dVar43)) / dVar43;
  dVar20 = pdVar1[7];
  if ((dVar13 != 0.0) || (local_b18 = dVar5, NAN(dVar13))) {
    local_b18 = (double)in_RDI[0x31];
  }
  dVar44 = cbrt(dVar5);
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b20 = 1.0 / dVar44;
  }
  dVar10 = dVar10 * dVar15 * local_b20;
  dVar15 = sqrt(dVar10);
  dVar45 = sqrt(dVar10);
  dVar45 = dVar10 * dVar45;
  dVar33 = dVar33 * dVar35 * local_b20 * local_b20;
  dVar35 = log(16.081979498692537 /
               (dVar33 * 0.123235 + dVar45 * 0.204775 + dVar15 * 3.79785 + dVar10 * 0.8969) + 1.0);
  dVar35 = (dVar10 * 0.053425 + 1.0) * 0.0621814 * dVar35;
  dVar46 = log(32.16395899738507 /
               (dVar33 * 0.1562925 + dVar45 * 0.420775 + dVar15 * 7.05945 + dVar10 * 1.549425) + 1.0
              );
  dVar15 = log(29.608749977793437 /
               (dVar33 * 0.1241775 + dVar45 * 0.1100325 + dVar15 * 5.1785 + dVar10 * 0.905775) + 1.0
              );
  dVar15 = (dVar10 * 0.0278125 + 1.0) * dVar15;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_b30 = 0.0;
  }
  else {
    local_b30 = (local_b18 *
                (dVar38 * 0.0197516734986138 * dVar15 +
                dVar38 * (dVar15 * -0.0197516734986138 +
                         (dVar10 * 0.05137 + 1.0) * -0.0310907 * dVar46 + dVar35) + -dVar35)) / 2.0;
  }
  dVar10 = in_RCX[2];
  dVar15 = dVar31 * 0.46914023462026644 + 1.0;
  dVar18 = dVar29 * dVar29;
  dVar33 = dVar25 * dVar25;
  dVar35 = in_RCX[2] * in_RCX[2];
  dVar35 = dVar35 * dVar35 * dVar35;
  dVar14 = dVar14 * dVar14 * dVar14 * dVar14;
  dVar14 = 1.0 / (dVar14 * dVar14);
  dVar38 = dVar15 * dVar15;
  dVar38 = (1.0 / (dVar38 * dVar38)) / dVar38;
  dVar9 = dVar9 * 1.4422495703074083 * 2.519842099789747 * (1.0 / dVar12);
  dVar12 = sqrt(dVar9);
  dVar45 = sqrt(dVar9);
  dVar45 = dVar9 * dVar45;
  dVar34 = dVar28 * 1.5874010519681996 * dVar34;
  dVar28 = log(16.081979498692537 /
               (dVar34 * 0.123235 + dVar45 * 0.204775 + dVar12 * 3.79785 + dVar9 * 0.8969) + 1.0);
  dVar28 = (dVar9 * 0.053425 + 1.0) * 0.0621814 * dVar28;
  local_b40 = local_b48;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_b40 = dVar11 * dVar6;
  }
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b48 = dVar44 * dVar5;
  }
  dVar5 = ((local_b40 + local_b48) - 2.0) * 1.9236610509315362;
  dVar13 = log(32.16395899738507 /
               (dVar34 * 0.1562925 + dVar45 * 0.420775 + dVar12 * 7.05945 + dVar9 * 1.549425) + 1.0)
  ;
  dVar12 = log(29.608749977793437 /
               (dVar34 * 0.1241775 + dVar45 * 0.1100325 + dVar12 * 5.1785 + dVar9 * 0.905775) + 1.0)
  ;
  dVar12 = (dVar9 * 0.0278125 + 1.0) * dVar12;
  dVar6 = pdVar1[9];
  dVar24 = dVar24 * 0.3 * (dVar21 + dVar32);
  dVar32 = dVar21 * 2.0 * dVar32;
  dVar21 = dVar24 - dVar32;
  dVar21 = dVar21 * dVar21;
  dVar24 = dVar24 + dVar32;
  dVar24 = dVar24 * dVar24;
  dVar7 = pdVar1[10];
  dVar32 = dVar21 * dVar21 * dVar21;
  dVar34 = (1.0 / (dVar24 * dVar24)) / dVar24;
  dVar11 = pdVar1[0xb];
  dVar23 = sqrt(dVar23 + dVar31);
  dVar23 = cbrt(dVar23 * 1.4142135623730951);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_ac0 + local_ae8 +
         local_b10 *
         (dVar20 * dVar39 * dVar39 * (1.0 / (dVar40 * dVar40)) * 0.010661445329398458 * dVar41 *
          dVar42 * dVar43 +
         dVar36 * dVar41 * 0.010661445329398458 * dVar42 * dVar43 +
         dVar19 * dVar39 * (1.0 / dVar40) +
         dVar8 * dVar16 * 0.46914023462026644 * dVar22 * (1.0 / dVar37) +
         dVar17 * dVar26 * (1.0 / dVar27)) +
         local_b30 *
         (dVar20 * dVar18 * dVar18 * (1.0 / (dVar33 * dVar33)) * 0.010661445329398458 * dVar35 *
          dVar14 * dVar38 +
         dVar36 * dVar35 * 0.010661445329398458 * dVar14 * dVar38 +
         dVar19 * dVar18 * (1.0 / dVar33) +
         dVar8 * dVar10 * 0.46914023462026644 * dVar30 * (1.0 / dVar15) +
         dVar17 * dVar29 * (1.0 / dVar25)) +
         (((dVar5 * 0.0197516734986138 * dVar12 +
           dVar4 * dVar4 * dVar4 * dVar4 * (1.0 / (__x * __x * __x * __x)) *
           dVar5 * (dVar12 * -0.0197516734986138 +
                   (dVar9 * 0.05137 + 1.0) * -0.0310907 * dVar13 + dVar28) + -dVar28) - local_b10) -
         local_b30) *
         (dVar7 * dVar32 * dVar34 + dVar6 * dVar21 * (1.0 / dVar24) + pdVar1[8] +
          (dVar11 * dVar32 * dVar34 * 1.2599210498948732 * dVar23 * dVar23) / 2.0 +
         (pdVar1[0xc] * dVar21 * (1.0 / dVar24) * 1.2599210498948732 * dVar23 * dVar23) / 2.0) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_pol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t2, t3, t4, t5, t6, t7, t9, t10;
  double t12, t15, t16, t18, t19, t20, t21, t25;
  double t26, t28, t29, t30, t31, t34, t35, t36;
  double t41, t45, t46, tzk0;

  gga_c_wi_params *params;

  assert(p->params != NULL);
  params = (gga_c_wi_params * )(p->params);

  t2 = sigma[0] + 0.2e1 * sigma[1] + sigma[2];
  t3 = params->b * t2;
  t4 = rho[0] + rho[1];
  t5 = t4 * t4;
  t6 = POW_1_3(t4);
  t7 = t6 * t6;
  t9 = 0.1e1 / t7 / t5;
  t10 = params->k * t2;
  t12 = exp(-t10 * t9);
  t15 = t3 * t9 * t12 + params->a;
  t16 = M_CBRT3;
  t18 = POW_1_3(0.1e1 / M_PI);
  t19 = t16 * t18;
  t20 = M_CBRT4;
  t21 = t20 * t20;
  t25 = t16 * t16;
  t26 = M_CBRTPI;
  t28 = sqrt(t2);
  t29 = t28 * t2;
  t30 = t5 * t5;
  t31 = 0.1e1 / t30;
  t34 = 0.1e1 / t6 / t4;
  t35 = t28 * t34;
  t36 = sqrt(t35);
  t41 = 0.1e1 + params->d * t20 * t25 * t26 * t36 * t29 * t31 / 0.3e1;
  t45 = params->c + t19 * t21 / t6 * t41 / 0.4e1;
  t46 = 0.1e1 / t45;
  tzk0 = t15 * t46;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}